

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_library_init.c
# Opt level: O1

void * ares_realloc_zero(void *ptr,size_t orig_size,size_t new_size)

{
  void *pvVar1;
  
  pvVar1 = (*__ares_realloc)(ptr,new_size);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else if (orig_size <= new_size && new_size - orig_size != 0) {
    memset((void *)((long)pvVar1 + orig_size),0,new_size - orig_size);
  }
  return pvVar1;
}

Assistant:

void *ares_realloc_zero(void *ptr, size_t orig_size, size_t new_size)
{
  void *p = ares_realloc(ptr, new_size);
  if (p == NULL) {
    return NULL;
  }

  if (new_size > orig_size) {
    memset((unsigned char *)p + orig_size, 0, new_size - orig_size);
  }

  return p;
}